

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool run_container_equals_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  uint64_t *puVar3;
  int32_t n_runs;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  _Bool _Var13;
  
  lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
  if ((*(uint *)(lVar5 + 4) & 0x20) == 0) {
    iVar8 = container1->n_runs;
    lVar5 = (long)iVar8;
    if (0 < lVar5) {
      lVar7 = 0;
      do {
        iVar8 = iVar8 + (uint)container1->runs[lVar7].length;
        lVar7 = lVar7 + 1;
      } while (lVar5 != lVar7);
    }
  }
  else {
    iVar8 = _avx2_run_container_cardinality(container1);
  }
  iVar4 = container2->cardinality;
  if (iVar4 == -1) {
    iVar4 = bitset_container_compute_cardinality(container2);
  }
  if (iVar4 == iVar8) {
    uVar10 = (ulong)container1->n_runs;
    if ((long)uVar10 < 1) {
      _Var13 = true;
    }
    else {
      uVar11 = 0;
      do {
        uVar1 = container1->runs[uVar11].value;
        uVar2 = container1->runs[uVar11].length;
        if (uVar2 == 0) {
          if ((container2->words[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) == 0) goto LAB_0010d20a;
        }
        else {
          uVar6 = (uint)uVar2 + (uint)uVar1 + 1;
          puVar3 = container2->words;
          uVar9 = -1L << ((byte)uVar1 & 0x3f);
          uVar12 = -1L << ((byte)uVar6 & 0x3f);
          uVar6 = uVar6 >> 6;
          if (uVar1 >> 6 == uVar6) {
            if ((uVar9 & ~(puVar3[uVar1 >> 6] | uVar12)) != 0) goto LAB_0010d20a;
          }
          else {
            if ((puVar3[uVar1 >> 6] < uVar9) ||
               (((uint)uVar2 + (uint)uVar1 < 0xffff &&
                ((uVar12 | puVar3[uVar6]) != 0xffffffffffffffff)))) goto LAB_0010d20a;
            uVar9 = (ulong)(uVar1 >> 6);
            while ((uVar9 < 0x3ff && (uVar9 + 1 < (ulong)uVar6))) {
              lVar5 = uVar9 + 1;
              uVar9 = uVar9 + 1;
              if (puVar3[lVar5] != 0xffffffffffffffff) goto LAB_0010d20a;
            }
          }
        }
        uVar11 = uVar11 + 1;
        _Var13 = uVar10 <= uVar11;
      } while (uVar11 != uVar10);
    }
  }
  else {
LAB_0010d20a:
    _Var13 = false;
  }
  return _Var13;
}

Assistant:

bool run_container_equals_bitset(const run_container_t* container1,
                                 const bitset_container_t* container2) {

    int run_card = run_container_cardinality(container1);
    int bitset_card = (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) ?
                      container2->cardinality :
                      bitset_container_compute_cardinality(container2);
    if (bitset_card != run_card) {
        return false;
    }

    for (int32_t i = 0; i < container1->n_runs; i++) {
        uint32_t begin = container1->runs[i].value;
        if (container1->runs[i].length) {
            uint32_t end = begin + container1->runs[i].length + 1;
            if (!bitset_container_contains_range(container2, begin, end)) {
                return false;
            }
        } else {
            if (!bitset_container_contains(container2, begin)) {
                return false;
            }
        }
    }

    return true;
}